

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

int __thiscall
QtPrivate::QGenericArrayOps<QSslCertificate>::truncate
          (QGenericArrayOps<QSslCertificate> *this,char *__file,__off_t __length)

{
  QSslCertificate *pQVar1;
  int extraout_EAX;
  
  pQVar1 = (this->super_QArrayDataPointer<QSslCertificate>).ptr;
  std::_Destroy_aux<false>::__destroy<QSslCertificate*>
            (pQVar1 + (long)__file,pQVar1 + (this->super_QArrayDataPointer<QSslCertificate>).size);
  (this->super_QArrayDataPointer<QSslCertificate>).size = (qsizetype)__file;
  return extraout_EAX;
}

Assistant:

void truncate(size_t newSize)
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(!this->isShared());
        Q_ASSERT(newSize < size_t(this->size));

        std::destroy(this->begin() + newSize, this->end());
        this->size = newSize;
    }